

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

int VP8LGetBackwardReferences
              (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
              int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
              int *cache_bits_best,WebPPicture *pic,int percent_range,int *percent)

{
  uint *puVar1;
  int *piVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t pix;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  VP8LBackwardRefs *pVVar13;
  void *ptr;
  VP8LColorCache *pVVar14;
  ulong uVar15;
  VP8LHistogram *pVVar16;
  uint64_t uVar17;
  PixOrCopy *pPVar18;
  byte bVar19;
  short sVar20;
  uint uVar21;
  VP8LHashChain *pVVar22;
  long *plVar23;
  VP8LBackwardRefs *pVVar24;
  uint uVar25;
  VP8LBackwardRefs *refs_dst;
  int dist;
  uint uVar26;
  PixOrCopy *v;
  ulong uVar27;
  PixOrCopy *pPVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  PixOrCopy v_00;
  VP8LBackwardRefs *pVVar33;
  long lVar34;
  ushort uVar35;
  uint uVar36;
  undefined4 in_register_0000008c;
  uint32_t *puVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint32_t *puVar41;
  ulong uVar42;
  uint32_t *puVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  int lz77_types_best [2];
  VP8LHashChain local_268;
  VP8LBackwardRefs *local_250;
  VP8LHistogram *local_248;
  uint *local_240;
  int local_234;
  WebPPicture *local_230;
  VP8LBackwardRefs *local_228;
  ulong local_220;
  ulong local_218;
  uint64_t local_210;
  long local_208;
  long *local_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  ulong local_1e0;
  int *local_1d8;
  long local_1d0;
  long local_1c8;
  ulong local_1c0;
  VP8LColorCache hashers_1;
  VP8LRefsCursor c;
  int window_offsets [32];
  int cc_init [11];
  
  pVVar24 = (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try);
  if (low_effort == 0) {
    local_240 = (uint *)cache_bits_best;
    local_234 = percent_range;
    local_1d8 = percent;
    local_230 = pic;
    lz77_types_best[0] = 0;
    lz77_types_best[1] = 0;
    local_1f8 = 0xffffffff;
    uStack_1f4 = 0xffffffff;
    uStack_1f0 = 0xffffffff;
    uStack_1ec = 0xffffffff;
    local_228 = refs + 1;
    local_250 = refs;
    refs_dst = refs + 2;
    if (do_no_cache == 0) {
      refs_dst = local_228;
    }
    local_268.offset_length = (uint32_t *)0x0;
    local_268.size = 0;
    local_268._12_4_ = 0;
    local_248 = VP8LAllocateHistogram(10);
    if (local_248 == (VP8LHistogram *)0x0) {
LAB_00138a54:
      WebPSafeFree(local_268.offset_length);
      local_268.size = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_268._8_8_;
      local_268 = (VP8LHashChain)(auVar7 << 0x40);
      VP8LFreeHistogram(local_248);
      iVar8 = WebPEncodingSetError(local_230,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar8;
    }
    iVar8 = height * width;
    local_210 = (long)iVar8;
    local_1e0 = (long)(iVar8 + -2);
    local_208 = -(long)width;
    local_1d0 = (ulong)(uint)width << 0x20;
    pVVar13 = (VP8LBackwardRefs *)(ulong)(uint)cache_bits_max;
    if (quality < 0x1a) {
      pVVar13 = (VP8LBackwardRefs *)0x0;
    }
    local_1c8 = (long)(int)pVVar13;
    lVar34 = -1;
    if (-1 < local_1c8) {
      lVar34 = local_1c8;
    }
    uVar45 = lVar34 + 1;
    bVar19 = 0x20 - (char)pVVar13;
    local_200 = (long *)(window_offsets + (long)pVVar13 * 4);
    uVar40 = 1;
    for (; pVVar16 = local_248, lz77_types_to_try != 0;
        lz77_types_to_try = lz77_types_to_try & uVar38) {
      if ((lz77_types_to_try & uVar40) != 0) {
        pVVar22 = hash_chain;
        if (uVar40 == 1) {
LAB_0013831d:
          uVar38 = BackwardReferencesLz77
                             (width,height,argb,(int)pVVar22,(VP8LHashChain *)refs_dst,pVVar24);
        }
        else if (uVar40 == 4) {
          iVar12 = VP8LHashChainInit(&local_268,iVar8);
          if (iVar12 == 0) goto LAB_00138a54;
          window_offsets[0x1c] = 0;
          window_offsets[0x1d] = 0;
          window_offsets[0x1e] = 0;
          window_offsets[0x1f] = 0;
          window_offsets[0x18] = 0;
          window_offsets[0x19] = 0;
          window_offsets[0x1a] = 0;
          window_offsets[0x1b] = 0;
          window_offsets[0x14] = 0;
          window_offsets[0x15] = 0;
          window_offsets[0x16] = 0;
          window_offsets[0x17] = 0;
          window_offsets[0x10] = 0;
          window_offsets[0x11] = 0;
          window_offsets[0x12] = 0;
          window_offsets[0x13] = 0;
          window_offsets[0xc] = 0;
          window_offsets[0xd] = 0;
          window_offsets[0xe] = 0;
          window_offsets[0xf] = 0;
          window_offsets[8] = 0;
          window_offsets[9] = 0;
          window_offsets[10] = 0;
          window_offsets[0xb] = 0;
          window_offsets[4] = 0;
          window_offsets[5] = 0;
          window_offsets[6] = 0;
          window_offsets[7] = 0;
          window_offsets[0] = 0;
          window_offsets[1] = 0;
          window_offsets[2] = 0;
          window_offsets[3] = 0;
          hashers_1.colors = (uint32_t *)0x0;
          hashers_1.hash_shift = 0;
          hashers_1.hash_bits = 0;
          ptr = WebPSafeMalloc(local_210,2);
          if (ptr != (void *)0x0) {
            *(undefined2 *)((long)ptr + local_1e0 * 2 + 2) = 1;
            for (uVar15 = local_1e0; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
              sVar20 = 1;
              if (argb[uVar15 & 0xffffffff] == argb[(uVar15 & 0xffffffff) + 1]) {
                sVar20 = *(short *)((long)ptr + uVar15 * 2 + 2);
                sVar20 = (ushort)(sVar20 != 0xfff) + sVar20;
              }
              *(short *)((long)ptr + uVar15 * 2) = sVar20;
            }
            iVar9 = 0;
            for (iVar12 = 0; iVar12 != 7; iVar12 = iVar12 + 1) {
              for (iVar10 = -6; iVar10 != 7; iVar10 = iVar10 + 1) {
                dist = iVar9 + iVar10;
                if ((0 < dist) && (iVar11 = VP8LDistanceToPlaneCode(width,dist), iVar11 < 0x21)) {
                  window_offsets[(long)iVar11 + -1] = dist;
                }
              }
              iVar9 = iVar9 + width;
            }
            lVar34 = 0;
            uVar15 = 0;
            while( true ) {
              uVar38 = (uint)uVar15;
              if (lVar34 == 0x20) break;
              if (window_offsets[lVar34] != 0) {
                uVar15 = (ulong)(uVar38 + 1);
                window_offsets[(int)uVar38] = window_offsets[lVar34];
              }
              lVar34 = lVar34 + 1;
            }
            uVar29 = 0;
            local_218 = 0;
            if (0 < (int)uVar38) {
              local_218 = uVar15;
            }
            local_220 = 0;
            for (; uVar26 = (uint)local_220, uVar29 != local_218; uVar29 = uVar29 + 1) {
              lVar34 = 0;
              bVar46 = false;
              while ((lVar34 < (int)uVar38 && (!bVar46))) {
                piVar2 = window_offsets + lVar34;
                lVar34 = lVar34 + 1;
                bVar46 = window_offsets[uVar29] == *piVar2 + 1;
              }
              if (!bVar46) {
                *(int *)((long)&hashers_1.colors + (long)(int)uVar26 * 4) = window_offsets[uVar29];
                local_220 = (ulong)(uVar26 + 1);
              }
            }
            *local_268.offset_length = 0;
            pVVar33 = (VP8LBackwardRefs *)0xffffffffffffffff;
            uVar36 = 0xffffffff;
            local_1c0 = uVar45;
            for (uVar15 = 1; (long)uVar15 < (long)local_210; uVar15 = uVar15 + 1) {
              if ((~hash_chain->offset_length[uVar15] & 0xfff) == 0) {
                uVar32 = hash_chain->offset_length[uVar15] >> 0xc;
                uVar29 = 0;
                do {
                  if (local_218 == uVar29) goto LAB_0013819b;
                  puVar1 = (uint *)(window_offsets + uVar29);
                  uVar29 = uVar29 + 1;
                } while (uVar32 != *puVar1);
                uVar21 = 0xfff;
                pVVar24 = (VP8LBackwardRefs *)(ulong)uVar32;
LAB_001382dd:
                pVVar33 = pVVar24;
                uVar32 = (int)pVVar33 << 0xc | uVar21;
                pVVar24 = pVVar33;
                uVar36 = uVar21;
              }
              else {
LAB_0013819b:
                bVar46 = uVar36 - 2 < 0xffd;
                uVar32 = uVar38;
                if (bVar46) {
                  uVar32 = uVar26;
                }
                uVar21 = uVar36 - 1;
                if (!bVar46) {
                  uVar21 = 0;
                }
                uVar31 = (uint)pVVar33;
                if (!bVar46) {
                  uVar31 = 0;
                }
                if ((int)uVar32 < 1) {
                  uVar32 = 0;
                }
                pVVar24 = (VP8LBackwardRefs *)(ulong)uVar31;
                for (uVar29 = 0; uVar29 != uVar32; uVar29 = uVar29 + 1) {
                  pVVar14 = (VP8LColorCache *)window_offsets;
                  if (uVar36 - 2 < 0xffd) {
                    pVVar14 = &hashers_1;
                  }
                  uVar31 = *(uint *)((long)&pVVar14->colors + uVar29 * 4);
                  uVar30 = (int)uVar15 - uVar31;
                  if ((-1 < (int)uVar30) && (argb[uVar30] == argb[uVar15])) {
                    uVar39 = 0;
                    uVar42 = uVar15 & 0xffffffff;
                    do {
                      uVar4 = *(ushort *)((long)ptr + (ulong)uVar30 * 2);
                      uVar3 = *(ushort *)((long)ptr + (long)(int)uVar42 * 2);
                      uVar25 = (uint)uVar4;
                      if (uVar4 == uVar3) {
                        uVar30 = uVar30 + uVar25;
                        uVar42 = (ulong)((int)uVar42 + uVar25);
                      }
                      else {
                        uVar35 = uVar3;
                        if (uVar4 < uVar3) {
                          uVar35 = uVar4;
                        }
                        uVar25 = (uint)uVar35;
                      }
                      uVar39 = uVar39 + uVar25;
                    } while ((((uVar4 == uVar3) && (uVar39 < 0x1000)) && ((int)uVar42 < iVar8)) &&
                            (argb[uVar30] == argb[(int)uVar42]));
                    if ((int)uVar21 < (int)uVar39) {
                      if (0xffe < uVar39) {
                        uVar21 = 0xfff;
                        pVVar24 = (VP8LBackwardRefs *)(ulong)uVar31;
                        goto LAB_001382dd;
                      }
                      pVVar24 = (VP8LBackwardRefs *)(ulong)uVar31;
                      uVar21 = uVar39;
                    }
                  }
                }
                uVar32 = 0;
                uVar36 = 0;
                pVVar33 = (VP8LBackwardRefs *)0x0;
                if (4 < (int)uVar21) goto LAB_001382dd;
              }
              local_268.offset_length[uVar15] = uVar32;
            }
            *local_268.offset_length = 0;
            WebPSafeFree(ptr);
            pVVar22 = &local_268;
            goto LAB_0013831d;
          }
          uVar38 = 0;
        }
        else {
          if (uVar40 != 2) goto LAB_00138a54;
          VP8LClearBackwardRefs(refs_dst);
          VP8LBackwardRefsCursorAdd(refs_dst,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
          for (uVar38 = 1; (int)uVar38 < iVar8; uVar38 = uVar38 + iVar10) {
            iVar12 = iVar8 - uVar38;
            if (0xffe < (int)(iVar8 - uVar38)) {
              iVar12 = 0xfff;
            }
            puVar43 = argb + uVar38;
            iVar9 = 0;
            if (*puVar43 == puVar43[-1]) {
              iVar9 = (*VP8LVectorMismatch)(puVar43,argb + ((ulong)uVar38 - 1),iVar12);
            }
            iVar10 = 0;
            if ((width <= (int)uVar38) && (*puVar43 == puVar43[local_208])) {
              iVar10 = (*VP8LVectorMismatch)(puVar43,puVar43 + local_208,iVar12);
            }
            if ((iVar9 < 4) || (iVar9 < iVar10)) {
              if (iVar10 < 4) {
                v_00 = (PixOrCopy)((ulong)*puVar43 << 0x20 | 0x10000);
                iVar10 = 1;
              }
              else {
                v_00 = (PixOrCopy)(local_1d0 + (ulong)(uint)(iVar10 << 0x10) + 2);
              }
            }
            else {
              v_00 = (PixOrCopy)((ulong)(uint)(iVar9 << 0x10) | 0x100000002);
              iVar10 = iVar9;
            }
            VP8LBackwardRefsCursorAdd(refs_dst,v_00);
          }
          uVar38 = (uint)(refs_dst->error == 0);
        }
        if (uVar38 == 0) goto LAB_00138a54;
        uVar15 = 0;
        for (uVar38 = 1; -1 < (int)uVar38; uVar38 = uVar38 - 1) {
          uVar26 = cache_bits_max;
          if (uVar38 == 1) {
            uVar26 = 0;
          }
          if (uVar38 != 1 || do_no_cache != 0) {
            if (uVar38 == 0) {
              cc_init._32_12_ = SUB1612((undefined1  [16])0x0,4);
              cc_init._16_12_ = SUB1612((undefined1  [16])0x0,0);
              cc_init[7] = 0;
              cc_init[0] = 0;
              cc_init[1] = 0;
              cc_init[2] = 0;
              cc_init[3] = 0;
              c.cur_block = refs_dst->refs;
              if (c.cur_block == (PixOrCopyBlock *)0x0) {
                pPVar18 = (PixOrCopy *)0x0;
                c.last_pos = (PixOrCopy *)0x0;
              }
              else {
                pPVar18 = (c.cur_block)->start;
                c.last_pos = pPVar18 + (c.cur_block)->size;
              }
              c.cur_pos = pPVar18;
              hashers_1.colors = (uint32_t *)0x0;
              hashers_1.hash_shift = 0;
              hashers_1.hash_bits = 0;
              if ((int)pVVar13 == 0) {
                uVar26 = 0;
              }
              else {
                pVVar14 = (VP8LColorCache *)window_offsets;
                for (uVar29 = 0; uVar45 != uVar29; uVar29 = uVar29 + 1) {
                  iVar12 = (int)uVar29;
                  pVVar16 = VP8LAllocateHistogram(iVar12);
                  (&hashers_1.colors)[uVar29] = (uint32_t *)pVVar16;
                  if (pVVar16 == (VP8LHistogram *)0x0) goto LAB_0013874f;
                  VP8LHistogramInit(pVVar16,iVar12,1);
                  if (uVar29 != 0) {
                    iVar12 = VP8LColorCacheInit(pVVar14,iVar12);
                    cc_init[uVar29] = iVar12;
                    if (iVar12 == 0) goto LAB_0013874f;
                  }
                  pVVar14 = pVVar14 + 1;
                }
                puVar43 = hashers_1.colors;
                puVar41 = argb;
                while (pPVar18 != (PixOrCopy *)0x0) {
                  if (pPVar18->mode == '\0') {
                    uVar36 = *puVar41;
                    uVar42 = (ulong)(uVar36 >> 8 & 0xff);
                    uVar32 = uVar36 * 0x1e35a7bd >> (bVar19 & 0x1f);
                    puVar43[(ulong)(uVar36 & 0xff) + 0x102] =
                         puVar43[(ulong)(uVar36 & 0xff) + 0x102] + 1;
                    piVar2 = (int *)(*(long *)puVar43 + uVar42 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar29 = (ulong)(uVar36 >> 0x10 & 0xff);
                    puVar43[uVar29 + 2] = puVar43[uVar29 + 2] + 1;
                    puVar43[(ulong)(uVar36 >> 0x18) + 0x202] =
                         puVar43[(ulong)(uVar36 >> 0x18) + 0x202] + 1;
                    plVar23 = local_200;
                    for (pVVar33 = pVVar13; pVVar24 = (VP8LBackwardRefs *)(ulong)uVar32,
                        0 < (int)pVVar33;
                        pVVar33 = (VP8LBackwardRefs *)((long)&pVVar33[-1].last_block + 7)) {
                      if (*(uint *)(*plVar23 + (long)pVVar24 * 4) == uVar36) {
                        puVar37 = (uint32_t *)
                                  (*(long *)(&hashers_1.colors)[(long)pVVar33] +
                                   (long)(int)uVar32 * 4 + 0x460);
                      }
                      else {
                        *(uint *)(*plVar23 + (long)pVVar24 * 4) = uVar36;
                        puVar37 = (&hashers_1.colors)[(long)pVVar33];
                        puVar37[(ulong)(uVar36 & 0xff) + 0x102] =
                             puVar37[(ulong)(uVar36 & 0xff) + 0x102] + 1;
                        piVar2 = (int *)(*(long *)puVar37 + uVar42 * 4);
                        *piVar2 = *piVar2 + 1;
                        puVar37[uVar29 + 2] = puVar37[uVar29 + 2] + 1;
                        puVar37 = puVar37 + (ulong)(uVar36 >> 0x18) + 0x202;
                      }
                      *puVar37 = *puVar37 + 1;
                      uVar32 = (int)uVar32 >> 1;
                      plVar23 = plVar23 + -2;
                    }
                    puVar41 = puVar41 + 1;
                  }
                  else {
                    uVar4 = pPVar18->len;
                    uVar36 = (uint)uVar4;
                    if (uVar4 < 0x200) {
                      uVar32 = (uint)kPrefixEncodeCode[uVar4].code;
                    }
                    else {
                      uVar21 = uVar4 - 1;
                      uVar32 = 0x1f;
                      if (uVar21 != 0) {
                        for (; uVar21 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                        }
                      }
                      uVar32 = (uint)((uVar21 >> ((byte)(0x1e - (char)(uVar32 ^ 0x1f)) & 0x1f) & 1)
                                     != 0) + (uVar32 ^ 0x1f) * 2 ^ 0x3e;
                    }
                    uVar21 = ~*puVar41;
                    for (uVar29 = 0; uVar45 != uVar29; uVar29 = uVar29 + 1) {
                      piVar2 = (int *)(*(long *)(&hashers_1.colors)[uVar29] + 0x400 +
                                      (long)(int)uVar32 * 4);
                      *piVar2 = *piVar2 + 1;
                    }
                    do {
                      uVar32 = *puVar41;
                      if (uVar32 != uVar21) {
                        uVar31 = uVar32 * 0x1e35a7bd >> (bVar19 & 0x1f);
                        plVar23 = local_200;
                        for (pVVar24 = pVVar13; uVar21 = uVar32, 0 < (int)pVVar24;
                            pVVar24 = (VP8LBackwardRefs *)(ulong)((int)pVVar24 - 1)) {
                          *(uint *)(*plVar23 + (long)(int)uVar31 * 4) = uVar32;
                          uVar31 = (int)uVar31 >> 1;
                          plVar23 = plVar23 + -2;
                        }
                      }
                      puVar41 = puVar41 + 1;
                      uVar36 = uVar36 - 1;
                      pVVar24 = pVVar13;
                    } while (uVar36 != 0);
                  }
                  VP8LRefsCursorNext(&c);
                  pPVar18 = c.cur_pos;
                }
                uVar42 = 0xffffffffffffffff;
                uVar44 = (ulong)uVar26;
                for (uVar27 = 0; uVar26 = (uint)uVar44, uVar29 = uVar45, uVar45 != uVar27;
                    uVar27 = uVar27 + 1) {
                  uVar17 = VP8LHistogramEstimateBits((VP8LHistogram *)(&hashers_1.colors)[uVar27]);
                  uVar29 = uVar27 & 0xffffffff;
                  if (uVar42 <= uVar17 && uVar27 != 0) {
                    uVar17 = uVar42;
                    uVar29 = uVar44;
                  }
                  uVar42 = uVar17;
                  uVar44 = uVar29;
                }
LAB_0013874f:
                pVVar14 = (VP8LColorCache *)window_offsets;
                for (uVar42 = 0; uVar45 != uVar42; uVar42 = uVar42 + 1) {
                  if (cc_init[uVar42] != 0) {
                    VP8LColorCacheClear(pVVar14);
                  }
                  VP8LFreeHistogram((VP8LHistogram *)(&hashers_1.colors)[uVar42]);
                  pVVar14 = pVVar14 + 1;
                }
                if ((long)uVar29 <= local_1c8) goto LAB_00138a54;
                if (0 < (int)uVar26) {
                  window_offsets._8_8_ = refs_dst->refs;
                  if ((PixOrCopyBlock *)window_offsets._8_8_ == (PixOrCopyBlock *)0x0) {
                    pPVar28 = (PixOrCopy *)0x0;
                    pPVar18 = (PixOrCopy *)0x0;
                  }
                  else {
                    pPVar28 = ((PixOrCopyBlock *)window_offsets._8_8_)->start;
                    pPVar18 = pPVar28 + ((PixOrCopyBlock *)window_offsets._8_8_)->size;
                  }
                  window_offsets._0_8_ = pPVar28;
                  window_offsets._16_8_ = pPVar18;
                  iVar12 = VP8LColorCacheInit(&hashers_1,uVar26);
                  if (iVar12 == 0) goto LAB_00138a54;
                  iVar12 = 0;
                  while (pPVar28 != (PixOrCopy *)0x0) {
                    if (pPVar28->mode == '\0') {
                      uVar5 = pPVar28->argb_or_distance;
                      uVar32 = uVar5 * 0x1e35a7bd >> ((byte)hashers_1.hash_shift & 0x1f);
                      uVar36 = 0xffffffff;
                      if (hashers_1.colors[(int)uVar32] == uVar5) {
                        uVar36 = uVar32;
                      }
                      if ((int)uVar36 < 0) {
                        hashers_1.colors[(int)uVar32] = uVar5;
                      }
                      else {
                        *pPVar28 = (PixOrCopy)((ulong)uVar36 << 0x20 | 0x10001);
                      }
                      iVar9 = iVar12 + 1;
                    }
                    else {
                      iVar9 = (uint)pPVar28->len + iVar12;
                      for (lVar34 = (long)iVar12; iVar9 != lVar34; lVar34 = lVar34 + 1) {
                        uVar36 = argb[lVar34] * 0x1e35a7bd >> ((byte)hashers_1.hash_shift & 0x1f);
                        pVVar24 = (VP8LBackwardRefs *)(ulong)uVar36;
                        hashers_1.colors[(int)uVar36] = argb[lVar34];
                      }
                    }
                    VP8LRefsCursorNext((VP8LRefsCursor *)window_offsets);
                    iVar12 = iVar9;
                    pPVar28 = (PixOrCopy *)window_offsets._0_8_;
                  }
                  VP8LColorCacheClear(&hashers_1);
                }
              }
              if ((do_no_cache == 0) || (uVar36 = 0, uVar26 != 0)) goto LAB_00138380;
            }
            else {
LAB_00138380:
              uVar36 = uVar26;
              pVVar16 = local_248;
              VP8LHistogramCreate(local_248,refs_dst,uVar36);
              uVar15 = VP8LHistogramEstimateBits(pVVar16);
            }
            uVar29 = (ulong)uVar38;
            if (uVar15 < *(ulong *)(&local_1f8 + uVar29 * 2)) {
              if (uVar38 == 1) {
                iVar12 = BackwardRefsClone(refs_dst,local_228);
                if (iVar12 == 0) goto LAB_00138a54;
                *(ulong *)(&local_1f8 + uVar29 * 2) = uVar15;
                lz77_types_best[uVar29] = uVar40;
              }
              else {
                BackwardRefsSwap(refs_dst,local_250);
                *(ulong *)(&local_1f8 + uVar29 * 2) = uVar15;
                lz77_types_best[uVar29] = uVar40;
                if (uVar38 == 0) {
                  *local_240 = uVar36;
                }
              }
            }
          }
        }
      }
      uVar38 = ~uVar40;
      uVar40 = uVar40 * 2;
    }
    iVar8 = lz77_types_best[0];
    iVar12 = lz77_types_best[1];
    for (uVar40 = 1; -1 < (int)uVar40; uVar40 = uVar40 - 1) {
      if (uVar40 != 1 || do_no_cache != 0) {
        uVar45 = (ulong)uVar40;
        if (lz77_types_best[uVar45] == 1) {
          pVVar22 = hash_chain;
          if (0x18 < quality) {
LAB_0013894f:
            uVar38 = 0;
            if (uVar40 != 1) {
              uVar38 = *local_240;
            }
            pVVar24 = local_250 + uVar45;
            iVar9 = VP8LBackwardReferencesTraceBackwards
                              (width,height,argb,uVar38,pVVar22,pVVar24,refs_dst);
            if (iVar9 == 0) goto LAB_00138a54;
            VP8LHistogramCreate(pVVar16,refs_dst,uVar38);
            uVar17 = VP8LHistogramEstimateBits(pVVar16);
            if (uVar17 < *(ulong *)(&local_1f8 + uVar45 * 2)) {
              BackwardRefsSwap(refs_dst,pVVar24);
            }
          }
        }
        else if ((0x18 < quality) && (pVVar22 = &local_268, lz77_types_best[uVar45] == 4))
        goto LAB_0013894f;
        BackwardReferences2DLocality(width,local_250 + uVar45);
        if (((uVar40 == 1) && (iVar8 == iVar12)) && (*local_240 == 0)) {
          iVar8 = BackwardRefsClone(local_228,local_250);
          if (iVar8 == 0) goto LAB_00138a54;
          break;
        }
      }
    }
    WebPSafeFree(local_268.offset_length);
    local_268.size = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_268._8_8_;
    local_268 = (VP8LHashChain)(auVar6 << 0x40);
    VP8LFreeHistogram(local_248);
    pic = local_230;
    percent = local_1d8;
    percent_range = local_234;
  }
  else {
    *cache_bits_best = 0;
    iVar8 = BackwardReferencesLz77(width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,pVVar24);
    if ((iVar8 == 0) || (BackwardReferences2DLocality(width,refs), refs == (VP8LBackwardRefs *)0x0))
    {
      iVar8 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar8;
    }
    BackwardRefsSwap(refs,refs);
  }
  iVar8 = WebPReportProgress(pic,percent_range + *percent,percent);
  return iVar8;
}

Assistant:

int VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best, const WebPPicture* const pic, int percent_range,
    int* const percent) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
  }

  return WebPReportProgress(pic, *percent + percent_range, percent);
}